

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall cmFileListGeneratorBase::Search(cmFileListGeneratorBase *this,cmFileList *listing)

{
  int iVar1;
  allocator local_39;
  string local_38 [32];
  cmFileList *local_18;
  cmFileList *listing_local;
  cmFileListGeneratorBase *this_local;
  
  local_18 = listing;
  listing_local = (cmFileList *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  iVar1 = (*this->_vptr_cmFileListGeneratorBase[2])(this,local_38,local_18);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool cmFileListGeneratorBase::Search(cmFileList& listing)
{
  return this->Search("", listing);
}